

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_LES.cpp
# Opt level: O2

void __thiscall
NavierStokesBase::LES_setDomainBC
          (NavierStokesBase *this,array<amrex::LinOpBCType,_3UL> *mlmg_lobc,
          array<amrex::LinOpBCType,_3UL> *mlmg_hibc,int src_comp)

{
  pointer pGVar1;
  StateDescriptor *this_00;
  BCRec *pBVar2;
  uint uVar3;
  array<amrex::LinOpBCType,_3UL> *paVar4;
  LinOpBCType LVar5;
  int idim;
  long lVar6;
  
  this_00 = amrex::DescriptorList::operator[]((DescriptorList *)amrex::AmrLevel::desc_lst,0);
  pBVar2 = amrex::StateDescriptor::getBC(this_00,src_comp);
  pGVar1 = (((this->super_AmrLevel).parent)->super_AmrCore).super_AmrMesh.geom.
           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    if (*(char *)((long)(pGVar1->super_CoordSys).inv_dx + lVar6 + 0x19U) == '\x01') {
      mlmg_hibc->_M_elems[lVar6] = Periodic;
      LVar5 = Periodic;
      paVar4 = mlmg_lobc;
    }
    else {
      uVar3 = pBVar2->bc[lVar6] + 1;
      LVar5 = bogus;
      if (uVar3 < 6) {
        LVar5 = *(LinOpBCType *)(&DAT_00609c10 + (ulong)uVar3 * 4);
      }
      mlmg_lobc->_M_elems[lVar6] = LVar5;
      LVar5 = Neumann;
      paVar4 = mlmg_hibc;
      switch(pBVar2->bc[lVar6 + 3]) {
      default:
        LVar5 = bogus;
        break;
      case 1:
      case 2:
      case 4:
        break;
      case 3:
        LVar5 = Dirichlet;
        break;
      case -1:
        LVar5 = reflect_odd;
      }
    }
    paVar4->_M_elems[lVar6] = LVar5;
  }
  return;
}

Assistant:

void
NavierStokesBase::LES_setDomainBC (std::array<LinOpBCType,AMREX_SPACEDIM>& mlmg_lobc,
                        std::array<LinOpBCType,AMREX_SPACEDIM>& mlmg_hibc,
                        int src_comp)
{
    const BCRec& bc = get_desc_lst()[State_Type].getBC(src_comp);
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
        if (parent->Geom(0).isPeriodic(idim))
        {
            mlmg_lobc[idim] = mlmg_hibc[idim] = LinOpBCType::Periodic;
        }
        else
        {
            int pbc = bc.lo(idim);
            if (pbc == EXT_DIR)
            {
                mlmg_lobc[idim] = LinOpBCType::Dirichlet;
            }
            else if (pbc == FOEXTRAP      ||
                     pbc == HOEXTRAP      ||
                     pbc == REFLECT_EVEN)
            {
                mlmg_lobc[idim] = LinOpBCType::Neumann;
            }
            else if (pbc == REFLECT_ODD)
            {
                mlmg_lobc[idim] = LinOpBCType::reflect_odd;
            }
            else
            {
                mlmg_lobc[idim] = LinOpBCType::bogus;
            }

            pbc = bc.hi(idim);
            if (pbc == EXT_DIR)
            {
                mlmg_hibc[idim] = LinOpBCType::Dirichlet;
            }
            else if (pbc == FOEXTRAP      ||
                     pbc == HOEXTRAP      ||
                     pbc == REFLECT_EVEN)
            {
                mlmg_hibc[idim] = LinOpBCType::Neumann;
            }
            else if (pbc == REFLECT_ODD)
            {
                mlmg_hibc[idim] = LinOpBCType::reflect_odd;
            }
            else
            {
                mlmg_hibc[idim] = LinOpBCType::bogus;
            }
        }
    }
}